

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::PolarizableAtypeParameters> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<OpenMD::PolarizableAtypeParameters> *)0x2c59b8);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}